

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O2

int tbx_index_build(char *fn,int min_shift,tbx_conf_t *conf)

{
  int iVar1;
  BGZF *fp;
  tbx_t *tbx;
  
  iVar1 = bgzf_is_bgzf(fn);
  if (iVar1 == 1) {
    fp = bgzf_open(fn,"r");
    iVar1 = -1;
    if (fp != (BGZF *)0x0) {
      if ((fp->field_0x3 & 0x60) == 0) {
        bgzf_close(fp);
      }
      else {
        tbx = tbx_index(fp,min_shift,conf);
        bgzf_close(fp);
        if (tbx != (tbx_t *)0x0) {
          hts_idx_save(tbx->idx,fn,(uint)(min_shift < 1) * 2);
          tbx_destroy(tbx);
          iVar1 = 0;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"Not a BGZF file: %s\n",fn);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int tbx_index_build(const char *fn, int min_shift, const tbx_conf_t *conf)
{
    tbx_t *tbx;
    BGZF *fp;
    if ( bgzf_is_bgzf(fn)!=1 ) { fprintf(stderr,"Not a BGZF file: %s\n", fn); return -1; }
    if ((fp = bgzf_open(fn, "r")) == 0) return -1;
    if ( !fp->is_compressed ) { bgzf_close(fp); return -1; }
    tbx = tbx_index(fp, min_shift, conf);
    bgzf_close(fp);
    if ( !tbx ) return -1;
    hts_idx_save(tbx->idx, fn, min_shift > 0? HTS_FMT_CSI : HTS_FMT_TBI);
    tbx_destroy(tbx);
    return 0;
}